

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListIteratorTest_rbegin_rend_backward_Test::
~IntrusiveListIteratorTest_rbegin_rend_backward_Test
          (IntrusiveListIteratorTest_rbegin_rend_backward_Test *this)

{
  IntrusiveListIteratorTest_rbegin_rend_backward_Test *this_local;
  
  ~IntrusiveListIteratorTest_rbegin_rend_backward_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST_F(IntrusiveListIteratorTest, rbegin_rend_backward) {
  TestBackward(list_.rbegin(), list_.rend(), {1, 2, 3});
  TestBackward(clist_.rbegin(), clist_.rend(), {1, 2, 3});
}